

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<double>
          (BasicWriter<wchar_t> *this,double value,FormatSpec *spec)

{
  bool bVar1;
  int iVar2;
  Alignment AVar3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  size_t sVar7;
  BasicWriter<wchar_t> *pBVar8;
  CharPtr pwVar9;
  wchar_t *pwVar10;
  wchar_t *__src;
  FormatSpec *in_RSI;
  BasicWriter<wchar_t> *in_RDI;
  double in_XMM0_Qa;
  CharPtr p;
  int result;
  size_t buffer_size;
  wchar_t *start;
  uint n;
  wchar_t fill;
  uint width_for_sprintf;
  wchar_t *format_ptr;
  wchar_t format [10];
  uint width;
  size_t offset;
  CharPtr out_1;
  char *inf;
  size_t inf_size;
  CharPtr out;
  char *nan;
  size_t nan_size;
  char sign;
  bool upper;
  char type;
  double in_stack_fffffffffffffec8;
  Buffer<wchar_t> *in_stack_fffffffffffffed0;
  wchar_t *in_stack_fffffffffffffed8;
  BasicWriter<wchar_t> *in_stack_fffffffffffffee0;
  AlignSpec *in_stack_fffffffffffffef8;
  uint total_size;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar11;
  uint in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  BasicWriter<wchar_t> *in_stack_ffffffffffffff10;
  char *local_e8;
  char *local_e0;
  char local_d1;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  char code;
  wchar_t *local_a8;
  uint local_9c;
  uint local_94;
  wchar_t *local_90;
  undefined4 local_88;
  wchar_t local_84 [10];
  uint local_5c;
  size_t local_58;
  char *local_48;
  undefined8 local_40;
  char *local_30;
  undefined8 local_28;
  char local_1b;
  byte local_1a;
  char local_19;
  FormatSpec *local_18;
  double local_10;
  
  code = (char)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  local_19 = FormatSpec::type(in_RSI);
  local_1a = 0;
  iVar2 = (int)local_19;
  if (local_19 == '\0') {
    local_19 = 'g';
  }
  else if ((iVar2 == 0x41) || (iVar2 - 0x45U < 3)) {
    local_1a = 1;
  }
  else if ((iVar2 != 0x61) && (2 < iVar2 - 0x65U)) {
    internal::report_unknown_type
              (code,(char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  local_1b = '\0';
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnegative
                    ((double)in_stack_fffffffffffffed8);
  if (bVar1) {
    local_1b = '-';
    local_10 = -local_10;
  }
  else {
    bVar1 = FormatSpec::flag(local_18,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(local_18,2);
      local_d1 = '+';
      if (!bVar1) {
        local_d1 = ' ';
      }
      local_1b = local_d1;
    }
  }
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnotanumber<double>
                    (in_stack_fffffffffffffec8);
  if (bVar1) {
    local_28 = 4;
    if ((local_1a & 1) == 0) {
      local_e0 = " nan";
    }
    else {
      local_e0 = " NAN";
    }
    local_30 = local_e0;
    if (local_1b == '\0') {
      local_28 = 3;
      local_30 = local_e0 + 1;
    }
    pwVar9 = write_str<char>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             in_stack_fffffffffffffef8);
    if (local_1b != '\0') {
      *pwVar9 = (int)local_1b;
    }
  }
  else {
    bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isinfinity<double>
                      (in_stack_fffffffffffffec8);
    if (bVar1) {
      local_40 = 4;
      if ((local_1a & 1) == 0) {
        local_e8 = " inf";
      }
      else {
        local_e8 = " INF";
      }
      local_48 = local_e8;
      if (local_1b == '\0') {
        local_40 = 3;
        local_48 = local_e8 + 1;
      }
      pwVar9 = write_str<char>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               in_stack_fffffffffffffef8);
      if (local_1b != '\0') {
        *pwVar9 = (int)local_1b;
      }
    }
    else {
      local_58 = Buffer<wchar_t>::size(*(Buffer<wchar_t> **)(in_RDI + 8));
      local_5c = WidthSpec::width((WidthSpec *)local_18);
      if (local_1b != '\0') {
        Buffer<wchar_t>::size(*(Buffer<wchar_t> **)(in_RDI + 8));
        in_stack_ffffffffffffff04 = local_5c;
        if (local_5c < 2) {
          in_stack_ffffffffffffff04 = 1;
        }
        Buffer<wchar_t>::reserve(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
        if (local_5c != 0) {
          local_5c = local_5c - 1;
        }
        local_58 = local_58 + 1;
      }
      local_90 = local_84;
      local_88 = 0x25;
      local_94 = local_5c;
      bVar1 = FormatSpec::flag(local_18,8);
      if (bVar1) {
        pwVar10 = local_90 + 1;
        *local_90 = L'#';
        local_90 = pwVar10;
      }
      AVar3 = AlignSpec::align(&local_18->super_AlignSpec);
      if (AVar3 == ALIGN_CENTER) {
        local_94 = 0;
      }
      else {
        AVar3 = AlignSpec::align(&local_18->super_AlignSpec);
        if (AVar3 == ALIGN_LEFT) {
          *local_90 = L'-';
          local_90 = local_90 + 1;
        }
        if (local_5c != 0) {
          *local_90 = L'*';
          local_90 = local_90 + 1;
        }
      }
      iVar2 = FormatSpec::precision(local_18);
      if (-1 < iVar2) {
        pwVar10 = local_90 + 1;
        *local_90 = L'.';
        local_90 = local_90 + 2;
        *pwVar10 = L'*';
      }
      append_float_length<double>(in_RDI,&local_90,local_10);
      *local_90 = (int)local_19;
      local_90[1] = L'\0';
      local_90 = local_90 + 1;
      wVar4 = WidthSpec::fill((WidthSpec *)local_18);
      wVar4 = internal::BasicCharTraits<wchar_t>::cast(wVar4);
      while( true ) {
        while( true ) {
          sVar7 = Buffer<wchar_t>::capacity(*(Buffer<wchar_t> **)(in_RDI + 8));
          sVar7 = sVar7 - local_58;
          local_a8 = Buffer<wchar_t>::operator[](*(Buffer<wchar_t> **)(in_RDI + 8),local_58);
          total_size = (uint)((ulong)&local_88 >> 0x20);
          pwVar10 = local_a8;
          uVar11 = local_94;
          FormatSpec::precision(local_18);
          iVar2 = internal::CharTraits<wchar_t>::format_float<double>
                            (pwVar10,(size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                             (uint)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                             (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          wVar6 = (wchar_t)((ulong)pwVar10 >> 0x20);
          if (-1 < iVar2) break;
          in_stack_fffffffffffffed8 = *(wchar_t **)(in_RDI + 8);
          Buffer<wchar_t>::capacity(*(Buffer<wchar_t> **)(in_RDI + 8));
          Buffer<wchar_t>::reserve(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
        }
        local_9c = internal::to_unsigned<int>(iVar2);
        in_stack_fffffffffffffee0 = (BasicWriter<wchar_t> *)(local_58 + local_9c);
        pBVar8 = (BasicWriter<wchar_t> *)
                 Buffer<wchar_t>::capacity(*(Buffer<wchar_t> **)(in_RDI + 8));
        if (in_stack_fffffffffffffee0 < pBVar8) break;
        Buffer<wchar_t>::reserve(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      }
      if (local_1b != '\0') {
        AVar3 = AlignSpec::align(&local_18->super_AlignSpec);
        if (((AVar3 == ALIGN_RIGHT) ||
            (AVar3 = AlignSpec::align(&local_18->super_AlignSpec), AVar3 == ALIGN_DEFAULT)) &&
           (*local_a8 == L' ')) {
          local_a8[-1] = wVar4;
        }
        else {
          local_a8[-1] = (int)local_1b;
          local_1b = '\0';
        }
        local_9c = local_9c + 1;
      }
      AVar3 = AlignSpec::align(&local_18->super_AlignSpec);
      if ((AVar3 == ALIGN_CENTER) &&
         (uVar5 = WidthSpec::width((WidthSpec *)local_18), local_9c < uVar5)) {
        local_5c = WidthSpec::width((WidthSpec *)local_18);
        pwVar9 = grow_buffer(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
        pwVar10 = get(pwVar9);
        pwVar10 = pwVar10 + (local_5c - local_9c >> 1);
        __src = get(pwVar9);
        memmove(pwVar10,__src,(ulong)local_9c << 2);
        WidthSpec::width((WidthSpec *)local_18);
        fill_padding((CharPtr)CONCAT44(in_stack_ffffffffffffff04,uVar11),total_size,sVar7,wVar6);
      }
      else {
        wVar6 = WidthSpec::fill((WidthSpec *)local_18);
        if ((wVar6 != L' ') || (local_1b != '\0')) {
          while (*local_a8 == L' ') {
            *local_a8 = wVar4;
            local_a8 = local_a8 + 1;
          }
          if (local_1b != '\0') {
            local_a8[-1] = (int)local_1b;
          }
        }
        grow_buffer(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      }
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}